

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

void __thiscall QWidget::setMaximumHeight(QWidget *this,int h)

{
  long lVar1;
  pointer pQVar2;
  int in_ESI;
  long in_FS_OFFSET;
  QWidget *in_stack_00000008;
  uint expl;
  QWidgetPrivate *d;
  int in_stack_00000018;
  undefined4 in_stack_ffffffffffffffd0;
  undefined2 in_stack_ffffffffffffffd4;
  ushort uVar3;
  undefined2 in_stack_ffffffffffffffd6;
  undefined4 in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QWidget *)0x36baed);
  QWidgetPrivate::createExtra
            ((QWidgetPrivate *)
             CONCAT26(in_stack_ffffffffffffffd6,
                      CONCAT24(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)));
  pQVar2 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                     ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x36bb0a);
  uVar3 = *(ushort *)&pQVar2->field_0x7c >> 2 & 3 | (ushort)(in_ESI != 0xffffff) * 2;
  maximumSize((QWidget *)CONCAT44(in_ESI,in_stack_ffffffffffffffe0));
  QSize::width((QSize *)0x36bb44);
  setMaximumSize(in_stack_00000008,h,in_stack_00000018);
  pQVar2 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                     ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x36bb6a);
  *(ushort *)&pQVar2->field_0x7c =
       ((ushort)*(undefined4 *)&pQVar2->field_0x7c & 0xfff3) + (uVar3 & 3) * 4;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidget::setMaximumHeight(int h)
{
    Q_D(QWidget);
    d->createExtra();
    uint expl = d->extra->explicitMaxSize | (h == QWIDGETSIZE_MAX ? 0 : Qt::Vertical);
    setMaximumSize(maximumSize().width(), h);
    d->extra->explicitMaxSize = expl;
}